

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O0

bool iDynTree::moveLinkFramesToBeCompatibleWithURDFWithGivenBaseLink
               (Model *inputModel,Model *outputModel)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  LinkIndex LVar7;
  Model *pMVar8;
  mapped_type *this;
  Model *in_RSI;
  Model *in_RDI;
  bool okReduced;
  bool includeAllAdditionalFrames;
  bool addOriginalLinkFrameWith_original_frame_suffix;
  Position newLink_o_oldLink;
  Position oldLink_o_newLink;
  double distanceBetweenAxisAndOrigin;
  PrismaticJoint *prismJoint;
  RevoluteJoint *revJoint;
  Axis axis;
  IJointConstPtr jointToParent;
  LinkConstPtr parentLink;
  string childLinkName;
  LinkConstPtr childLink;
  TraversalIndex trvIdx;
  bool ok;
  Traversal fullTraversal;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
  newLink_H_oldLink;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  removedJointPositions;
  JointIndex jntIdx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  consideredJoints;
  undefined1 in_stack_000014b6;
  undefined1 in_stack_000014b7;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
  *in_stack_000014b8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_stack_000014c0;
  Model *in_stack_000014c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000014d0;
  Model *in_stack_000014d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000014f8;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  Traversal *in_stack_fffffffffffffb70;
  Traversal *in_stack_fffffffffffffb78;
  Model *in_stack_fffffffffffffb80;
  Traversal *in_stack_fffffffffffffb90;
  string *in_stack_fffffffffffffbe0;
  Model *in_stack_fffffffffffffbe8;
  long local_408;
  long *local_3e8;
  long local_3d8;
  string local_378 [32];
  undefined1 local_358 [112];
  Transform local_2e8 [56];
  JointIndex in_stack_fffffffffffffd50;
  Model *in_stack_fffffffffffffd58;
  Position local_288 [48];
  Position local_258 [48];
  double local_228;
  Axis local_220;
  Model *local_1f0;
  Axis local_1e8;
  long *local_1b8;
  Axis local_1b0;
  IJoint *local_180;
  Link *local_178;
  string local_170 [32];
  Link *local_150;
  long local_148;
  undefined4 local_140;
  undefined1 local_139;
  string local_68 [48];
  ulong local_38;
  Model *local_18;
  Model *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x45d454);
  for (local_38 = 0; uVar2 = local_38, sVar6 = Model::getNrOfJoints((Model *)0x45d47d),
      uVar2 < sVar6; local_38 = local_38 + 1) {
    Model::getJointName_abi_cxx11_(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb70,
                (value_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    std::__cxx11::string::~string(local_68);
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   *)0x45d548);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
                   *)0x45d555);
  Traversal::Traversal(in_stack_fffffffffffffb90);
  local_139 = Model::computeFullTreeTraversal(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  if ((bool)local_139) {
    for (local_148 = 1; lVar1 = local_148,
        uVar4 = Traversal::getNrOfVisitedLinks((Traversal *)0x45d60f), lVar1 < (long)(ulong)uVar4;
        local_148 = local_148 + 1) {
      local_150 = Traversal::getLink(in_stack_fffffffffffffb70,
                                     CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      Link::getIndex(local_150);
      Model::getLinkName_abi_cxx11_(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      local_178 = Traversal::getParentLink
                            (in_stack_fffffffffffffb70,
                             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      local_180 = Traversal::getParentJoint
                            (in_stack_fffffffffffffb70,
                             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      iVar5 = (*local_180->_vptr_IJoint[4])();
      if (iVar5 != 0) {
        Axis::Axis((Axis *)in_stack_fffffffffffffb70);
        if (local_180 == (IJoint *)0x0) {
          local_3d8 = 0;
        }
        else {
          local_3d8 = __dynamic_cast(local_180,&IJoint::typeinfo,&RevoluteJoint::typeinfo,0);
        }
        if (local_3d8 == 0) {
          if (local_180 == (IJoint *)0x0) {
            local_408 = 0;
          }
          else {
            local_408 = __dynamic_cast(local_180,&IJoint::typeinfo,&PrismaticJoint::typeinfo,0);
          }
          if (local_408 != 0) {
            if (local_180 == (IJoint *)0x0) {
              pMVar8 = (Model *)0x0;
            }
            else {
              pMVar8 = (Model *)__dynamic_cast(local_180,&IJoint::typeinfo,&PrismaticJoint::typeinfo
                                               ,0);
            }
            in_stack_fffffffffffffbe8 = pMVar8;
            local_1f0 = pMVar8;
            in_stack_fffffffffffffbe0 = (string *)Link::getIndex(local_150);
            (*pMVar8->_vptr_Model[0x27])
                      (&local_220,pMVar8,in_stack_fffffffffffffbe0,LINK_INVALID_INDEX);
            iDynTree::Axis::operator=(&local_1b0,&local_220);
          }
        }
        else {
          if (local_180 == (IJoint *)0x0) {
            local_3e8 = (long *)0x0;
          }
          else {
            local_3e8 = (long *)__dynamic_cast(local_180,&IJoint::typeinfo,&RevoluteJoint::typeinfo,
                                               0);
          }
          local_1b8 = local_3e8;
          LVar7 = Link::getIndex(local_150);
          (**(code **)(*local_3e8 + 0x138))(&local_1e8,local_3e8,LVar7,LINK_INVALID_INDEX);
          iDynTree::Axis::operator=(&local_1b0,&local_1e8);
        }
        iDynTree::Position::Zero();
        local_228 = (double)iDynTree::Axis::getDistanceBetweenAxisAndPoint((Position *)&local_1b0);
        if (1e-07 < local_228) {
          iDynTree::Position::Zero();
          iDynTree::Axis::getPointOnAxisClosestToGivenPoint(local_258);
          iDynTree::Position::operator-(local_288);
          iDynTree::Rotation::Identity();
          iDynTree::Transform::Transform(local_2e8,(Rotation *)(local_358 + 0x28),local_288);
          this = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
                               *)in_stack_fffffffffffffb70,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
          iDynTree::Transform::operator=(this,local_2e8);
        }
      }
      std::__cxx11::string::~string(local_170);
    }
    local_358[0x27] = 1;
    local_358[0x26] = 1;
    local_358._0_8_ = (pointer)0x0;
    local_358._8_8_ = (pointer)0x0;
    local_358._16_8_ = (pointer)0x0;
    in_stack_fffffffffffffb70 = (Traversal *)local_358;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x45db3b);
    bVar3 = createReducedModelAndChangeLinkFrames
                      (in_stack_000014d8,in_stack_000014d0,in_stack_000014c8,in_stack_000014c0,
                       in_stack_000014b8,(bool)in_stack_000014b7,(bool)in_stack_000014b6,
                       in_stack_000014f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffb80);
    local_358[0x25] = bVar3;
    if (bVar3) {
      Model::getDefaultBaseLink(local_10);
      Model::getLinkName_abi_cxx11_(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      pMVar8 = (Model *)Model::getLinkIndex(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
      Model::setDefaultBaseLink(pMVar8,(LinkIndex)in_stack_fffffffffffffb70);
      std::__cxx11::string::~string(local_378);
      local_1 = 1;
      in_stack_fffffffffffffb80 = local_18;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  local_140 = 1;
  Traversal::~Traversal(in_stack_fffffffffffffb70);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
                    *)0x45dcb1);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)0x45dcbe);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb80);
  return (bool)(local_1 & 1);
}

Assistant:

bool moveLinkFramesToBeCompatibleWithURDFWithGivenBaseLink(const iDynTree::Model& inputModel,
                                                                 iDynTree::Model& outputModel)
{

    // In this transformer we do not remove any joint, so the list of considered joints is exactly the list of joints in the input model
    std::vector<std::string> consideredJoints;
    for(iDynTree::JointIndex jntIdx=0; jntIdx < inputModel.getNrOfJoints(); jntIdx++)
    {
        consideredJoints.push_back(inputModel.getJointName(jntIdx));
    }

    // As we do not remove any joint, this map is empty
    std::unordered_map<std::string, double> removedJointPositions;

    // We now need to compute the newLink_H_oldLink transform for each link we need to transform
    std::unordered_map<std::string, iDynTree::Transform> newLink_H_oldLink;

    // First of all, compute the traversal for the default base of the model
    iDynTree::Traversal fullTraversal;
    bool ok = inputModel.computeFullTreeTraversal(fullTraversal);

    if (!ok)
    {
        return false;
    }

    // We start from 1 as the first link does not have any joint to the aparent link
    for (iDynTree::TraversalIndex trvIdx=1; trvIdx < static_cast<TraversalIndex>(fullTraversal.getNrOfVisitedLinks()); trvIdx++)
    {
        LinkConstPtr childLink = fullTraversal.getLink(trvIdx);
        std::string childLinkName = inputModel.getLinkName(childLink->getIndex());
        LinkConstPtr parentLink = fullTraversal.getParentLink(trvIdx);
        IJointConstPtr jointToParent = fullTraversal.getParentJoint(trvIdx);


        if (jointToParent->getNrOfDOFs() != 0)
        {
            iDynTree::Axis axis;

            // Check that the axis of the joint is supported by URDF
            if (dynamic_cast<const RevoluteJoint*>(jointToParent))
            {
                const RevoluteJoint* revJoint = dynamic_cast<const RevoluteJoint*>(jointToParent);
                axis = revJoint->getAxis(childLink->getIndex());
            }
            else if (dynamic_cast<const PrismaticJoint*>(jointToParent))
            {
                const PrismaticJoint* prismJoint = dynamic_cast<const PrismaticJoint*>(jointToParent);
                axis = prismJoint->getAxis(childLink->getIndex());
            }

            // If the axis is not URDF-compatible, move it to ensure that the new link frame lays on the
            // The threshold of 1e-7 is the same used in URDFStringFromModel, if you change it here also change it there
            double distanceBetweenAxisAndOrigin = axis.getDistanceBetweenAxisAndPoint(iDynTree::Position::Zero());
            if (distanceBetweenAxisAndOrigin > 1e-7)
            {

                // First of all, we get the point on the child axis closest to the existing origin
                iDynTree::Position oldLink_o_newLink = axis.getPointOnAxisClosestToGivenPoint(iDynTree::Position::Zero());

                // We invert the sign
                iDynTree::Position newLink_o_oldLink = -oldLink_o_newLink;


                newLink_H_oldLink[childLinkName] = iDynTree::Transform(iDynTree::Rotation::Identity(), newLink_o_oldLink);
            }
        }
    }

    bool addOriginalLinkFrameWith_original_frame_suffix = true;
    bool includeAllAdditionalFrames = true;
    bool okReduced = createReducedModelAndChangeLinkFrames(inputModel, consideredJoints, outputModel,
                                                 removedJointPositions, newLink_H_oldLink, addOriginalLinkFrameWith_original_frame_suffix, includeAllAdditionalFrames, {});

    if (okReduced)
    {
        // In general createReducedModelAndChangeLinkFrames do not preserve the existance of the base link,
        // but as in this case the link existence is preserved, we also preserve the default base link
        outputModel.setDefaultBaseLink(outputModel.getLinkIndex(inputModel.getLinkName(inputModel.getDefaultBaseLink())));
        return true;
    }
    else
    {
        return false;
    }
}